

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O3

void __thiscall
FIX::SocketAcceptor::onConnect
          (SocketAcceptor *this,SocketServer *server,socket_handle a,socket_handle s)

{
  _Rb_tree_header *p_Var1;
  NullLog *pNVar2;
  bool bVar3;
  int iVar4;
  _Base_ptr p_Var5;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  *__x;
  SocketConnection *this_00;
  mapped_type *ppSVar6;
  char *__s;
  size_t sVar7;
  _Base_ptr p_Var8;
  NullLog *pNVar9;
  uint16_t port;
  Sessions sessions;
  stringstream stream;
  key_type_conflict1 local_22e;
  socket_handle local_22c;
  long *local_228 [2];
  long local_218 [2];
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_208;
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_1d8;
  stringstream local_1a8 [16];
  long local_198 [14];
  ios_base local_128 [264];
  
  local_22c = s;
  bVar3 = socket_isValid(s);
  if (bVar3) {
    p_Var5 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var5 != (_Base_ptr)0x0) {
      p_Var1 = &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = &p_Var1->_M_header;
      do {
        if (s <= (int)p_Var5[1]._M_color) {
          p_Var8 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < s];
      } while (p_Var5 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var8 != p_Var1) && ((int)p_Var8[1]._M_color <= s)) {
        return;
      }
    }
    iVar4 = SocketServer::socketToPort(server,a);
    local_22e = (key_type_conflict1)iVar4;
    __x = &std::
           map<unsigned_short,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>_>_>_>
           ::operator[](&this->m_portToSessions,&local_22e)->_M_t;
    std::
    _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
    ::_Rb_tree(&local_1d8,__x);
    this_00 = (SocketConnection *)operator_new(0x2100);
    std::
    _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
    ::_Rb_tree(&local_208,&local_1d8);
    SocketConnection::SocketConnection(this_00,s,(Sessions *)&local_208,&server->m_monitor);
    ppSVar6 = std::
              map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
              ::operator[](&this->m_connections,&local_22c);
    *ppSVar6 = this_00;
    std::
    _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
    ::~_Rb_tree(&local_208);
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Accepted connection from ",0x19);
    __s = socket_peername(local_22c);
    if (__s == (char *)0x0) {
      std::ios::clear((int)(ostream *)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
    }
    else {
      sVar7 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,__s,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," on port ",9);
    std::ostream::_M_insert<unsigned_long>((ulong)local_198);
    pNVar2 = (NullLog *)(this->super_Acceptor).m_pLog;
    std::__cxx11::stringbuf::str();
    pNVar9 = &(this->super_Acceptor).m_nullLog;
    if (pNVar2 != (NullLog *)0x0) {
      pNVar9 = pNVar2;
    }
    (*(pNVar9->super_Log)._vptr_Log[6])(pNVar9,local_228);
    if (local_228[0] != local_218) {
      operator_delete(local_228[0],local_218[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base(local_128);
    std::
    _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
    ::~_Rb_tree(&local_1d8);
  }
  return;
}

Assistant:

void SocketAcceptor::onConnect(SocketServer &server, socket_handle a, socket_handle s) {
  if (!socket_isValid(s)) {
    return;
  }
  SocketConnections::iterator i = m_connections.find(s);
  if (i != m_connections.end()) {
    return;
  }
  uint16_t port = server.socketToPort(a);
  Sessions sessions = m_portToSessions[port];
  m_connections[s] = new SocketConnection(s, sessions, &server.getMonitor());

  std::stringstream stream;
  stream << "Accepted connection from " << socket_peername(s) << " on port " << port;

  if (getLog()) {
    getLog()->onEvent(stream.str());
  }
}